

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<unsigned_short,_unsigned_long,_0>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *t,unsigned_long *u,unsigned_short *result)

{
  if (*u != 0) {
    *result = (unsigned_short)((ulong)*t % *u);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }